

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

EffectiveSign __thiscall
slang::ast::BinaryExpression::getEffectiveSignImpl(BinaryExpression *this,bool isForConversion)

{
  EffectiveSign left;
  EffectiveSign right;
  BinaryExpression *in_RDI;
  undefined4 in_stack_ffffffffffffffdc;
  bool isForConversion_00;
  EffectiveSign local_4;
  
  isForConversion_00 = SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0);
  if (in_RDI->op < Equality) {
    BinaryExpression::left(in_RDI);
    left = Expression::getEffectiveSign(&in_RDI->super_Expression,isForConversion_00);
    BinaryExpression::right(in_RDI);
    right = Expression::getEffectiveSign(&in_RDI->super_Expression,SUB41(left >> 0x18,0));
    local_4 = Expression::conjunction(left,right);
  }
  else if (in_RDI->op - Equality < 0xe) {
    local_4 = Either;
  }
  else {
    BinaryExpression::left(in_RDI);
    local_4 = Expression::getEffectiveSign(&in_RDI->super_Expression,isForConversion_00);
  }
  return local_4;
}

Assistant:

Expression::EffectiveSign BinaryExpression::getEffectiveSignImpl(bool isForConversion) const {
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            return conjunction(left().getEffectiveSign(isForConversion),
                               right().getEffectiveSign(isForConversion));
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            return EffectiveSign::Either;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
        case BinaryOperator::Power:
            return left().getEffectiveSign(isForConversion);
    }
    SLANG_UNREACHABLE;
}